

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_3fPoint::IsNotZero(ON_3fPoint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  
  fVar1 = this->x;
  fVar2 = this->z;
  if ((((fVar1 != -1.234321e+38) || (bVar4 = false, NAN(fVar1))) &&
      (fVar3 = this->y, bVar4 = false, fVar2 != 0.0 || (fVar3 != 0.0 || fVar1 != 0.0))) &&
     ((fVar3 != -1.234321e+38 || (NAN(fVar3))))) {
    bVar4 = (bool)((fVar2 != 1.234321e+38 && fVar3 != 1.234321e+38) &
                  -(fVar1 != 1.234321e+38) & -(fVar2 != -1.234321e+38));
  }
  return bVar4;
}

Assistant:

bool ON_3fPoint::IsNotZero() const
{
  // the && (x != ON_UNSET_FLOAT && y != ON_UNSET_FLOAT && z != ON_UNSET_FLOAT) insures no coordinate is a Nan.
  return
    (x != 0.0f || y != 0.0f || z != 0.0f)
    && (x != ON_UNSET_FLOAT && y != ON_UNSET_FLOAT && z != ON_UNSET_FLOAT)
    && (x != ON_UNSET_POSITIVE_FLOAT && y != ON_UNSET_POSITIVE_FLOAT && z != ON_UNSET_POSITIVE_FLOAT);
}